

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_parsecfg.c
# Opt level: O2

int parseconfig(char *filename,GlobalConfig *global)

{
  byte bVar1;
  GlobalConfig *pGVar2;
  byte bVar3;
  CURLcode CVar4;
  int iVar5;
  uint c;
  ParameterError res;
  FILE *__stream;
  char *pcVar6;
  size_t sVar7;
  byte *flag;
  ulong uVar8;
  size_t sVar9;
  byte *pbVar10;
  byte *pbVar11;
  OperationConfig *pOVar12;
  byte *pbVar13;
  byte *pbVar14;
  _Bool usedarg;
  byte *local_1088;
  OperationConfig *local_1080;
  uint local_1074;
  byte *local_1070;
  ulong local_1068;
  GlobalConfig *local_1060;
  dynbuf buf;
  char buf_1 [4096];
  
  usedarg = false;
  pOVar12 = global->last;
  iVar5 = 1;
  if ((filename == (char *)0x0) || (bVar3 = *filename, bVar3 == 0)) {
    pcVar6 = homedir(".curlrc");
    if (pcVar6 == (char *)0x0) {
      pbVar13 = (byte *)0x0;
    }
    else {
      filename = (char *)curl_maprintf("%s%s.curlrc",pcVar6,"/");
      pbVar13 = (byte *)filename;
      if ((byte *)filename == (byte *)0x0) {
        free(pcVar6);
        return 1;
      }
    }
    free(pcVar6);
    if ((byte *)filename == (byte *)0x0) goto LAB_0011ac16;
    bVar3 = *filename;
  }
  else {
    pbVar13 = (byte *)0x0;
  }
  local_1070 = (byte *)filename;
  if ((bVar3 != 0x2d) || (__stream = _stdin, ((byte *)filename)[1] != 0)) {
    __stream = fopen64(filename,"r");
  }
  if (__stream != (FILE *)0x0) {
    local_1080 = pOVar12;
    local_1060 = global;
    curlx_dyn_init(&buf,0x19000);
    local_1074 = 0;
LAB_0011a817:
    iVar5 = 1;
    pcVar6 = fgets(buf_1,0x1000,__stream);
    if (pcVar6 == (char *)0x0) {
      sVar7 = curlx_dyn_len(&buf);
      if (sVar7 != 0) goto LAB_0011a85f;
      iVar5 = 0;
    }
    else {
      CVar4 = curlx_dyn_add(&buf,buf_1);
      if (CVar4 == CURLE_OK) goto code_r0x0011a83f;
    }
    goto LAB_0011abf8;
  }
  goto LAB_0011ac16;
code_r0x0011a83f:
  pcVar6 = strchr(buf_1,10);
  if (pcVar6 == (char *)0x0) goto LAB_0011a817;
LAB_0011a85f:
  flag = (byte *)curlx_dyn_ptr(&buf);
  if (flag == (byte *)0x0) goto LAB_0011abf8;
  local_1074 = local_1074 + 1;
  for (; *flag != 0; flag = flag + 1) {
    iVar5 = Curl_isspace((uint)*flag);
    if (iVar5 == 0) {
      bVar3 = *flag;
      uVar8 = (ulong)bVar3;
      pbVar14 = flag;
      local_1088 = pbVar13;
      if ((0x2f < uVar8) || ((0x840800002401U >> (uVar8 & 0x3f) & 1) == 0)) goto LAB_0011a8c8;
      break;
    }
  }
  goto LAB_0011a8b5;
LAB_0011a8c8:
  pbVar13 = pbVar14;
  if ((char)uVar8 == '\0') goto LAB_0011a909;
  iVar5 = Curl_isspace((int)uVar8);
  if (iVar5 != 0) {
    if (*pbVar14 != 0) {
LAB_0011a8fd:
      *pbVar14 = 0;
      pbVar14 = pbVar14 + 1;
      pbVar13 = pbVar14;
    }
    goto LAB_0011a909;
  }
  if ((bVar3 != 0x2d) && ((*pbVar14 == 0x3a || (*pbVar14 == 0x3d)))) goto LAB_0011a8fd;
  uVar8 = (ulong)pbVar14[1];
  pbVar14 = pbVar14 + 1;
  goto LAB_0011a8c8;
LAB_0011a909:
  pbVar13 = pbVar13 + 1;
  pbVar10 = pbVar14;
  if (*pbVar14 == 0) goto LAB_0011a93a;
  iVar5 = Curl_isspace((uint)*pbVar14);
  if (iVar5 == 0) {
    bVar1 = *pbVar14;
    c = (uint)bVar1;
    if ((bVar3 == 0x2d) || ((c != 0x3d && (c != 0x3a)))) {
      if (bVar1 != 0x22) goto LAB_0011a9d7;
      pbVar14 = pbVar14 + 1;
      sVar9 = strlen((char *)pbVar14);
      pbVar10 = (byte *)malloc(sVar9 + 1);
      pbVar11 = pbVar10;
      pbVar13 = local_1088;
      if (pbVar10 != (byte *)0x0) {
        do {
          bVar3 = *pbVar14;
          pbVar14 = pbVar14 + 1;
          do {
            if (bVar3 != 0x5c) {
              if ((bVar3 != 0) && (bVar3 != 0x22)) goto switchD_0011a9a7_caseD_6f;
              *pbVar11 = 0;
              local_1068 = (ulong)(bVar1 == 0x22);
              goto LAB_0011aa52;
            }
            bVar3 = *pbVar14;
            pbVar14 = pbVar14 + 1;
          } while (bVar3 == 0);
          switch(bVar3) {
          case 0x6e:
            bVar3 = 10;
            break;
          case 0x72:
            bVar3 = 0xd;
            break;
          case 0x74:
            bVar3 = 9;
            break;
          case 0x76:
            bVar3 = 0xb;
          }
switchD_0011a9a7_caseD_6f:
          *pbVar11 = bVar3;
          pbVar11 = pbVar11 + 1;
        } while( true );
      }
      iVar5 = 1;
      goto LAB_0011abf8;
    }
  }
  pbVar14 = pbVar14 + 1;
  goto LAB_0011a909;
LAB_0011a93a:
  c = 0;
LAB_0011a9d7:
  do {
    if ((char)c == '\0') goto LAB_0011aa35;
    iVar5 = Curl_isspace(c);
    if (iVar5 != 0) {
      if (*pbVar10 != 0) {
        *pbVar10 = 0;
        break;
      }
      goto LAB_0011aa35;
    }
    c = (uint)pbVar10[1];
    pbVar13 = pbVar13 + 1;
    pbVar10 = pbVar10 + 1;
  } while( true );
  while( true ) {
    iVar5 = Curl_isspace((uint)*pbVar10);
    pbVar13 = pbVar10 + 1;
    if (iVar5 == 0) break;
    pbVar10 = pbVar13;
    if (*pbVar10 == 0) goto LAB_0011aa35;
  }
  if ((0x23 < (ulong)*pbVar10) || ((0x800002401U >> ((ulong)*pbVar10 & 0x3f) & 1) == 0)) {
    warnf(local_1080->global,
          "%s:%d: warning: \'%s\' uses unquoted whitespace in the line that may cause side-effects!\n"
          ,local_1070,(ulong)local_1074,flag);
  }
LAB_0011aa35:
  local_1068 = 0;
  pbVar10 = (byte *)0x0;
  pbVar13 = local_1088;
  if (*pbVar14 != 0) {
    pbVar10 = pbVar14;
  }
LAB_0011aa52:
  pGVar2 = local_1060;
  local_1088 = pbVar10;
  res = getparameter((char *)flag,(char *)pbVar10,&usedarg,local_1060,local_1080);
  local_1080 = pGVar2->last;
  if ((local_1088 == (byte *)0x0) || (res != PARAM_OK)) {
    if (res != PARAM_OK) {
      if (res == PARAM_NEXT_OPERATION) {
        if ((local_1080->url_list != (getout *)0x0) && (local_1080->url_list->url != (char *)0x0)) {
          pOVar12 = (OperationConfig *)malloc(0x538);
          local_1080->next = pOVar12;
          res = PARAM_NO_MEM;
          if (pOVar12 == (OperationConfig *)0x0) goto LAB_0011ab3f;
          config_init(pOVar12);
          pOVar12 = local_1080->next;
          pOVar12->global = local_1060;
          local_1060->last = pOVar12;
          pOVar12->prev = local_1080;
          local_1080 = pOVar12;
        }
      }
      else {
LAB_0011ab3f:
        if ((*local_1070 == 0x2d) && (local_1070[1] == 0)) {
          local_1070 = (byte *)0x11f51b;
        }
        if (res - PARAM_GOT_EXTRA_PARAMETER < 0xfffffffc) {
          pcVar6 = param2text(res);
          warnf(local_1080->global,"%s:%d: warning: \'%s\' %s\n",local_1070,(ulong)local_1074,flag,
                pcVar6);
        }
      }
    }
  }
  else if ((*local_1088 != 0) && (res = PARAM_GOT_EXTRA_PARAMETER, usedarg == false))
  goto LAB_0011ab3f;
  if ((char)local_1068 != '\0') {
    free(local_1088);
  }
LAB_0011a8b5:
  curlx_dyn_reset(&buf);
  goto LAB_0011a817;
LAB_0011abf8:
  curlx_dyn_free(&buf);
  if (__stream != _stdin) {
    fclose(__stream);
  }
LAB_0011ac16:
  curl_free(pbVar13);
  return iVar5;
}

Assistant:

int parseconfig(const char *filename, struct GlobalConfig *global)
{
  FILE *file = NULL;
  bool usedarg = FALSE;
  int rc = 0;
  struct OperationConfig *operation = global->last;
  char *pathalloc = NULL;

  if(!filename || !*filename) {
    /* NULL or no file name attempts to load .curlrc from the homedir! */

    char *home = homedir(".curlrc");
#ifndef WIN32
    if(home) {
      pathalloc = curl_maprintf("%s%s.curlrc", home, DIR_CHAR);
      if(!pathalloc) {
        free(home);
        return 1; /* out of memory */
      }
      filename = pathalloc;
    }
#else /* Windows */
    if(home) {
      int i = 0;
      char prefix = '.';
      do {
        /* if it was allocated in a previous attempt */
        curl_free(pathalloc);
        /* check for .curlrc then _curlrc in the home dir */
        pathalloc = curl_maprintf("%s%s%ccurlrc", home, DIR_CHAR, prefix);
        if(!pathalloc) {
          free(home);
          return 1; /* out of memory */
        }

        /* Check if the file exists - if not, try _curlrc */
        file = fopen(pathalloc, FOPEN_READTEXT);
        if(file) {
          filename = pathalloc;
          break;
        }
        prefix = '_';
      } while(++i < 2);
    }
    if(!filename) {
      /* check for .curlrc then _curlrc in the dir of the executable */
      file = execpath(".curlrc");
      if(!file)
        file = execpath("_curlrc");
    }
#endif

    Curl_safefree(home); /* we've used it, now free it */
  }

  if(!file && filename) { /* no need to fopen() again */
    if(strcmp(filename, "-"))
      file = fopen(filename, FOPEN_READTEXT);
    else
      file = stdin;
  }

  if(file) {
    char *line;
    char *option;
    char *param;
    int lineno = 0;
    bool dashed_option;
    struct curlx_dynbuf buf;
    bool fileerror;
    curlx_dyn_init(&buf, MAX_CONFIG_LINE_LENGTH);

    while(my_get_line(file, &buf, &fileerror)) {
      int res;
      bool alloced_param = FALSE;
      lineno++;
      line = curlx_dyn_ptr(&buf);
      if(!line) {
        rc = 1; /* out of memory */
        break;
      }

      /* line with # in the first non-blank column is a comment! */
      while(*line && ISSPACE(*line))
        line++;

      switch(*line) {
      case '#':
      case '/':
      case '\r':
      case '\n':
      case '*':
      case '\0':
        curlx_dyn_reset(&buf);
        continue;
      }

      /* the option keywords starts here */
      option = line;

      /* the option starts with a dash? */
      dashed_option = option[0]=='-'?TRUE:FALSE;

      while(*line && !ISSPACE(*line) && !ISSEP(*line, dashed_option))
        line++;
      /* ... and has ended here */

      if(*line)
        *line++ = '\0'; /* null-terminate, we have a local copy of the data */

#ifdef DEBUG_CONFIG
      fprintf(stderr, "GOT: %s\n", option);
#endif

      /* pass spaces and separator(s) */
      while(*line && (ISSPACE(*line) || ISSEP(*line, dashed_option)))
        line++;

      /* the parameter starts here (unless quoted) */
      if(*line == '\"') {
        /* quoted parameter, do the quote dance */
        line++;
        param = malloc(strlen(line) + 1); /* parameter */
        if(!param) {
          /* out of memory */
          rc = 1;
          break;
        }
        alloced_param = TRUE;
        (void)unslashquote(line, param);
      }
      else {
        param = line; /* parameter starts here */
        while(*line && !ISSPACE(*line))
          line++;

        if(*line) {
          *line = '\0'; /* null-terminate */

          /* to detect mistakes better, see if there's data following */
          line++;
          /* pass all spaces */
          while(*line && ISSPACE(*line))
            line++;

          switch(*line) {
          case '\0':
          case '\r':
          case '\n':
          case '#': /* comment */
            break;
          default:
            warnf(operation->global, "%s:%d: warning: '%s' uses unquoted "
                  "whitespace in the line that may cause side-effects!\n",
                  filename, lineno, option);
          }
        }
        if(!*param)
          /* do this so getparameter can check for required parameters.
             Otherwise it always thinks there's a parameter. */
          param = NULL;
      }

#ifdef DEBUG_CONFIG
      fprintf(stderr, "PARAM: \"%s\"\n",(param ? param : "(null)"));
#endif
      res = getparameter(option, param, &usedarg, global, operation);
      operation = global->last;

      if(!res && param && *param && !usedarg)
        /* we passed in a parameter that wasn't used! */
        res = PARAM_GOT_EXTRA_PARAMETER;

      if(res == PARAM_NEXT_OPERATION) {
        if(operation->url_list && operation->url_list->url) {
          /* Allocate the next config */
          operation->next = malloc(sizeof(struct OperationConfig));
          if(operation->next) {
            /* Initialise the newly created config */
            config_init(operation->next);

            /* Set the global config pointer */
            operation->next->global = global;

            /* Update the last operation pointer */
            global->last = operation->next;

            /* Move onto the new config */
            operation->next->prev = operation;
            operation = operation->next;
          }
          else
            res = PARAM_NO_MEM;
        }
      }

      if(res != PARAM_OK && res != PARAM_NEXT_OPERATION) {
        /* the help request isn't really an error */
        if(!strcmp(filename, "-")) {
          filename = "<stdin>";
        }
        if(res != PARAM_HELP_REQUESTED &&
           res != PARAM_MANUAL_REQUESTED &&
           res != PARAM_VERSION_INFO_REQUESTED &&
           res != PARAM_ENGINES_REQUESTED) {
          const char *reason = param2text(res);
          warnf(operation->global, "%s:%d: warning: '%s' %s\n",
                filename, lineno, option, reason);
        }
      }

      if(alloced_param)
        Curl_safefree(param);

      curlx_dyn_reset(&buf);
    }
    curlx_dyn_free(&buf);
    if(file != stdin)
      fclose(file);
    if(fileerror)
      rc = 1;
  }
  else
    rc = 1; /* couldn't open the file */

  curl_free(pathalloc);
  return rc;
}